

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.h
# Opt level: O0

cmCommand * __thiscall cmInstallCommand::Clone(cmInstallCommand *this)

{
  cmInstallCommand *this_00;
  cmInstallCommand *this_local;
  
  this_00 = (cmInstallCommand *)operator_new(0x50);
  cmInstallCommand(this_00);
  return &this_00->super_cmCommand;
}

Assistant:

cmCommand* Clone() override { return new cmInstallCommand; }